

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopFont(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  ImFont *font;
  uint uVar3;
  
  pIVar2 = GImGui;
  ImDrawList::PopTextureID(GImGui->CurrentWindow->DrawList);
  iVar1 = (pIVar2->FontStack).Size;
  if (iVar1 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                  ,0x4e1,"void ImVector<ImFont *>::pop_back() [T = ImFont *]");
  }
  uVar3 = iVar1 - 1;
  (pIVar2->FontStack).Size = uVar3;
  if (uVar3 == 0) {
    font = GetDefaultFont();
  }
  else {
    if (iVar1 == 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4ca,"value_type &ImVector<ImFont *>::back() [T = ImFont *]");
    }
    font = (pIVar2->FontStack).Data[(ulong)uVar3 - 1];
  }
  SetCurrentFont(font);
  return;
}

Assistant:

void  ImGui::PopFont()
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow->DrawList->PopTextureID();
    g.FontStack.pop_back();
    SetCurrentFont(g.FontStack.empty() ? GetDefaultFont() : g.FontStack.back());
}